

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::record_value_if_available<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,maybe<pstore::command_line::option_*,_void> *handler,
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *value,string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  bool bVar1;
  int iVar2;
  option **ppoVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  string *psVar6;
  bool ok;
  bool local_41;
  maybe<pstore::command_line::option_*,_void> local_40;
  
  local_41 = true;
  ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->
                      ((maybe<pstore::command_line::option_*,_void> *)this);
  iVar2 = (*(*ppoVar3)->_vptr_option[0xe])();
  if ((char)iVar2 == '\0') {
    if (handler->valid_ != false) {
      poVar5 = std::operator<<((ostream *)program_name,(string *)value);
      poVar5 = std::operator<<(poVar5,": Argument \'");
      ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->
                          ((maybe<pstore::command_line::option_*,_void> *)this);
      psVar6 = option::name_abi_cxx11_(*ppoVar3);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::operator<<(poVar5,"\' does not take a value\n");
      local_41 = false;
      goto LAB_0010d3b7;
    }
    ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->
                        ((maybe<pstore::command_line::option_*,_void> *)this);
    iVar2 = (*(*ppoVar3)->_vptr_option[0x10])();
    local_41 = SUB41(iVar2,0);
  }
  else {
    if (handler->valid_ == false) goto LAB_0010d3b7;
    maybe<pstore::command_line::option_*,_void>::maybe
              (&local_40,(maybe<pstore::command_line::option_*,_void> *)this);
    pbVar4 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator->((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)handler);
    bVar1 = handler_set_value(&local_40,pbVar4);
    if (local_40.valid_ == true) {
      local_40.valid_ = false;
    }
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)program_name,(string *)value);
      poVar5 = std::operator<<(poVar5,": Unknown value \'");
      pbVar4 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::operator->((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                             *)handler);
      poVar5 = std::operator<<(poVar5,(string *)pbVar4);
      std::operator<<(poVar5,"\'");
      local_41 = false;
    }
  }
  if (*this == (details)0x1) {
    *this = (details)0x0;
  }
LAB_0010d3b7:
  std::tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool>::
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool_&,_true>
            (__return_storage_ptr__,(maybe<pstore::command_line::option_*,_void> *)this,&local_41);
  return __return_storage_ptr__;
}

Assistant:

auto record_value_if_available (maybe<option *> handler,
                                            maybe<std::string> const & value,
                                            std::string const & program_name, ErrorStream & errs)
                -> std::tuple<maybe<option *>, bool> {
                using str = stream_trait<typename ErrorStream::char_type>;
                bool ok = true;
                if ((*handler)->takes_argument ()) {
                    if (value) {
                        if (!handler_set_value (handler, *value)) {
                            errs << str::out_string (program_name)
                                 << str::out_text (": Unknown value '") << str::out_string (*value)
                                 << str::out_text ("'");
                            ok = false;
                        }
                        handler.reset ();
                    } else {
                        // The option takes an argument but we haven't yet seen the value
                        // string.
                    }
                } else {
                    if (value) {
                        // We got a value but don't want one.
                        errs << str::out_string (program_name) << str::out_text (": Argument '")
                             << str::out_string ((*handler)->name ())
                             << str::out_text ("' does not take a value\n");
                        ok = false;
                    } else {
                        ok = (*handler)->add_occurrence ();
                        handler.reset ();
                    }
                }
                return std::make_tuple (std::move (handler), ok);
            }